

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O2

void stats_init(device_stats *stats,ixy_device *dev)

{
  stats->rx_pkts = 0;
  stats->tx_pkts = 0;
  stats->rx_bytes = 0;
  stats->tx_bytes = 0;
  stats->device = dev;
  if (dev != (ixy_device *)0x0) {
    (*dev->read_stats)(dev,(device_stats *)0x0);
    return;
  }
  return;
}

Assistant:

void stats_init(struct device_stats* stats, struct ixy_device* dev) {
	// might require device-specific initialization
	stats->rx_pkts = 0;
	stats->tx_pkts = 0;
	stats->rx_bytes = 0;
	stats->tx_bytes = 0;
	stats->device = dev;
	if (dev) {
		ixy_read_stats(dev, NULL);
	}
}